

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype anon_unknown.dwarf_ab58a6::qLastIndexOf<QLatin1String>
                    (QLatin1String haystack,QChar needle,qsizetype from,CaseSensitivity cs)

{
  char16_t cVar1;
  char16_t cVar2;
  qsizetype qVar3;
  ulong uVar4;
  char16_t *pcVar5;
  char *pcVar6;
  ulong in_RCX;
  int in_R8D;
  long in_FS_OFFSET;
  char *n;
  char *b;
  char16_t c;
  char *local_48;
  ulong local_30;
  long local_28;
  QChar local_1a;
  QLatin1String local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QLatin1String::size(&local_18);
  if (qVar3 == 0) {
    local_28 = -1;
  }
  else {
    if ((long)in_RCX < 0) {
      qVar3 = QLatin1String::size(&local_18);
      local_30 = qVar3 + in_RCX;
    }
    else {
      uVar4 = QLatin1String::size(&local_18);
      local_30 = in_RCX;
      if (uVar4 < in_RCX) {
        qVar3 = QLatin1String::size(&local_18);
        local_30 = qVar3 - 1;
      }
    }
    if (-1 < (long)local_30) {
      pcVar5 = QChar::unicode(&local_1a);
      cVar2 = *pcVar5;
      pcVar6 = QLatin1String::data(&local_18);
      local_48 = pcVar6 + local_30;
      if (in_R8D == 1) {
        for (; pcVar6 <= local_48; local_48 = local_48 + -1) {
          cVar1 = valueTypeToUtf16<char>(*local_48);
          if (cVar1 == cVar2) {
            local_28 = (long)local_48 - (long)pcVar6;
            goto LAB_0052e4f4;
          }
        }
      }
      else {
        cVar2 = foldCase(L'\0');
        for (; pcVar6 <= local_48; local_48 = local_48 + -1) {
          valueTypeToUtf16<char>(*local_48);
          cVar1 = foldCase(L'\0');
          if (cVar1 == cVar2) {
            local_28 = (long)local_48 - (long)pcVar6;
            goto LAB_0052e4f4;
          }
        }
      }
    }
    local_28 = -1;
  }
LAB_0052e4f4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

static inline qsizetype qLastIndexOf(Haystack haystack, QChar needle,
                                     qsizetype from, Qt::CaseSensitivity cs) noexcept
{
    if (haystack.size() == 0)
        return -1;
    if (from < 0)
        from += haystack.size();
    else if (std::size_t(from) > std::size_t(haystack.size()))
        from = haystack.size() - 1;
    if (from >= 0) {
        char16_t c = needle.unicode();
        const auto b = haystack.data();
        auto n = b + from;
        if (cs == Qt::CaseSensitive) {
            for (; n >= b; --n)
                if (valueTypeToUtf16(*n) == c)
                    return n - b;
        } else {
            c = foldCase(c);
            for (; n >= b; --n)
                if (foldCase(valueTypeToUtf16(*n)) == c)
                    return n - b;
        }
    }
    return -1;
}